

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

string * __thiscall
absl::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  pointer __dest;
  pointer __dest_00;
  size_t __n;
  size_t __n_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)(a->piece_).length_ + (char)*(undefined8 *)(this + 8) + (char)(b->piece_).length_
            );
  __dest_00 = (__return_storage_ptr__->_M_dataplus)._M_p;
  __dest = __dest_00 + *(size_t *)(this + 8);
  memcpy(__dest_00,*(void **)this,*(size_t *)(this + 8));
  __n = (a->piece_).length_;
  memcpy(__dest,(a->piece_).ptr_,__n);
  __n_00 = (b->piece_).length_;
  memcpy(__dest + __n,(b->piece_).ptr_,__n_00);
  if (__dest + __n + __n_00 == __dest_00 + __return_storage_ptr__->_M_string_length) {
    return __return_storage_ptr__;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0x75,"string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &)");
}

Assistant:

string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c) {
  string result;
  strings_internal::STLStringResizeUninitialized(
      &result, a.size() + b.size() + c.size());
  char* const begin = &*result.begin();
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + result.size());
  return result;
}